

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,ImDrawFlags flags,
          float thickness)

{
  ImVec2 *pIVar1;
  ImVec4 *pIVar2;
  ImVec2 IVar3;
  ImDrawVert *pIVar4;
  ImDrawListSharedData *pIVar5;
  ImVec4 *pIVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  ImVec2 *pIVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  uint *puVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  bool bVar27;
  float fVar28;
  ImVec2 IVar29;
  float fVar34;
  ImVec2 IVar30;
  ImVec2 IVar31;
  ImVec2 IVar32;
  ImVec2 IVar33;
  float fVar35;
  float fVar36;
  float fVar43;
  ImVec2 IVar37;
  ImVec2 IVar38;
  ImVec2 IVar39;
  ImVec2 IVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  ImVec2 IVar44;
  ImVec2 IVar45;
  ImVec2 IVar46;
  ImVec2 IVar47;
  ImVec2 IVar48;
  ImVec2 IVar49;
  ImVec2 IVar50;
  
  if (0xffffff < col && 1 < points_count) {
    uVar25 = (ulong)(uint)points_count;
    uVar22 = points_count - 1;
    uVar14 = (ulong)uVar22;
    IVar3 = this->_Data->TexUvWhitePixel;
    uVar18 = (ulong)(uint)points_count;
    if ((flags & 1U) == 0) {
      uVar18 = uVar14;
    }
    iVar16 = (int)uVar18;
    if ((this->Flags & 1U) == 0) {
      PrimReserve(this,iVar16 * 6,iVar16 * 4);
      if (0 < iVar16) {
        uVar14 = 1;
        do {
          uVar12 = uVar14;
          if (uVar25 == uVar14) {
            uVar12 = 0;
          }
          fVar28 = points[uVar14 - 1].x;
          fVar35 = points[uVar12].x - fVar28;
          fVar34 = points[uVar14 - 1].y;
          auVar41._4_4_ = points[uVar12].y - fVar34;
          auVar41._0_4_ = fVar35 * fVar35 + auVar41._4_4_ * auVar41._4_4_;
          auVar41._8_8_ = 0;
          if (0.0 < auVar41._0_4_) {
            auVar42 = rsqrtss(auVar41,auVar41);
            auVar41._4_4_ = auVar41._4_4_ * auVar42._0_4_;
            fVar35 = fVar35 * auVar42._0_4_;
          }
          auVar41._4_4_ = auVar41._4_4_ * thickness * 0.5;
          fVar35 = fVar35 * thickness * 0.5;
          pIVar4 = this->_VtxWritePtr;
          IVar29.y = fVar34 - fVar35;
          IVar29.x = fVar28 + auVar41._4_4_;
          pIVar4->pos = IVar29;
          pIVar4->uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4->col = col;
          pIVar4[1].pos.x = points[uVar12].x + auVar41._4_4_;
          pIVar4[1].pos.y = points[uVar12].y - fVar35;
          pIVar4[1].uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[1].col = col;
          pIVar4[2].pos.x = points[uVar12].x - auVar41._4_4_;
          pIVar4[2].pos.y = points[uVar12].y + fVar35;
          pIVar4[2].uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[2].col = col;
          pIVar4[3].pos.x = points[uVar14 - 1].x - auVar41._4_4_;
          pIVar4[3].pos.y = points[uVar14 - 1].y + fVar35;
          pIVar4[3].uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[3].col = col;
          this->_VtxWritePtr = pIVar4 + 4;
          puVar21 = this->_IdxWritePtr;
          *puVar21 = this->_VtxCurrentIdx;
          puVar21[1] = this->_VtxCurrentIdx + 1;
          puVar21[2] = this->_VtxCurrentIdx + 2;
          puVar21[3] = this->_VtxCurrentIdx;
          puVar21[4] = this->_VtxCurrentIdx + 2;
          puVar21[5] = this->_VtxCurrentIdx + 3;
          this->_IdxWritePtr = puVar21 + 6;
          this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
          bVar27 = uVar14 != uVar18;
          uVar14 = uVar14 + 1;
        } while (bVar27);
      }
    }
    else {
      auVar41._4_4_ = thickness;
      if (thickness <= 1.0) {
        auVar41._4_4_ = 1.0;
      }
      iVar15 = (int)auVar41._4_4_;
      fVar35 = this->_FringeScale;
      bVar20 = fVar35 == 1.0 & iVar15 < 0x3f & (byte)this->Flags >> 1 &
               auVar41._4_4_ - (float)iVar15 <= 1e-05;
      iVar11 = 0x12;
      if (thickness <= fVar35) {
        iVar11 = 0xc;
      }
      iVar17 = 6;
      if (bVar20 == 0) {
        iVar17 = iVar11;
      }
      if (bVar20 == 1) {
        iVar11 = points_count * 2;
        iVar23 = 3;
      }
      else {
        iVar11 = points_count * 3;
        if (fVar35 < thickness) {
          iVar11 = points_count * 4;
        }
        iVar23 = (uint)(fVar35 < thickness) * 2 + 3;
      }
      PrimReserve(this,iVar17 * iVar16,iVar11);
      pIVar5 = this->_Data;
      uVar24 = iVar23 * points_count;
      if ((pIVar5->TempBuffer).Capacity < (int)uVar24) {
        pIVar10 = (pIVar5->TempBuffer).Data;
        if (pIVar10 != (ImVec2 *)0x0) {
          ImGui::MemFree(pIVar10);
        }
        pIVar10 = (ImVec2 *)ImGui::MemAlloc((ulong)uVar24 << 3);
        (pIVar5->TempBuffer).Data = pIVar10;
        (pIVar5->TempBuffer).Capacity = uVar24;
      }
      pIVar10 = (this->_Data->TempBuffer).Data;
      if (0 < iVar16) {
        uVar12 = 1;
        do {
          uVar19 = uVar12;
          if (uVar25 == uVar12) {
            uVar19 = 0;
          }
          fVar28 = points[uVar19].x - points[uVar12 - 1].x;
          fVar34 = points[uVar19].y - points[uVar12 - 1].y;
          auVar42._0_4_ = fVar28 * fVar28 + fVar34 * fVar34;
          auVar42._4_4_ = fVar34;
          auVar42._8_8_ = 0;
          if (0.0 < auVar42._0_4_) {
            auVar42 = rsqrtss(auVar42,auVar42);
            fVar28 = fVar28 * auVar42._0_4_;
            fVar34 = fVar34 * auVar42._0_4_;
          }
          pIVar10[uVar12 - 1].x = fVar34;
          pIVar10[uVar12 - 1].y = -fVar28;
          bVar27 = uVar12 != uVar18;
          uVar12 = uVar12 + 1;
        } while (bVar27);
      }
      pIVar1 = pIVar10 + uVar25;
      if ((flags & 1U) == 0) {
        pIVar10[uVar14] = pIVar1[-2];
      }
      uVar24 = col & 0xffffff;
      if ((thickness <= fVar35 | bVar20) == 1) {
        if (bVar20 != 0) {
          fVar35 = auVar41._4_4_ * 0.5 + 1.0;
        }
        if ((flags & 1U) == 0) {
          IVar30.x = (*points).x + (*pIVar10).x * fVar35;
          IVar30.y = (*points).y + (*pIVar10).y * fVar35;
          *pIVar1 = IVar30;
          IVar31.x = (*points).x - (*pIVar10).x * fVar35;
          IVar31.y = (*points).y - (*pIVar10).y * fVar35;
          pIVar1[1] = IVar31;
          IVar32.x = points[uVar14].x + pIVar10[uVar14].x * fVar35;
          IVar32.y = points[uVar14].y + pIVar10[uVar14].y * fVar35;
          pIVar1[uVar22 * 2] = IVar32;
          IVar8.y = points[uVar14].y - pIVar10[uVar14].y * fVar35;
          IVar8.x = points[uVar14].x - pIVar10[uVar14].x * fVar35;
          pIVar1[(ulong)(uVar22 * 2) + 1] = IVar8;
        }
        if (0 < iVar16) {
          puVar21 = this->_IdxWritePtr;
          uVar14 = 1;
          uVar22 = this->_VtxCurrentIdx;
          do {
            uVar12 = uVar14 & 0xffffffff;
            if (uVar25 == uVar14) {
              uVar12 = 0;
            }
            uVar26 = uVar22 + (bVar20 ^ 3);
            if (uVar25 == uVar14) {
              uVar26 = this->_VtxCurrentIdx;
            }
            auVar41._4_4_ = (pIVar10[uVar12].x + pIVar10[uVar14 - 1].x) * 0.5;
            fVar28 = (pIVar10[uVar12].y + pIVar10[uVar14 - 1].y) * 0.5;
            fVar34 = auVar41._4_4_ * auVar41._4_4_ + fVar28 * fVar28;
            if (1e-06 < fVar34) {
              fVar34 = 1.0 / fVar34;
              fVar36 = 100.0;
              if (fVar34 <= 100.0) {
                fVar36 = fVar34;
              }
              auVar41._4_4_ = auVar41._4_4_ * fVar36;
              fVar28 = fVar28 * fVar36;
            }
            uVar19 = (ulong)(uint)((int)uVar12 * 2);
            IVar44.x = points[uVar12].x + auVar41._4_4_ * fVar35;
            IVar44.y = points[uVar12].y + fVar28 * fVar35;
            pIVar1[uVar19] = IVar44;
            IVar45.x = points[uVar12].x - auVar41._4_4_ * fVar35;
            IVar45.y = points[uVar12].y - fVar28 * fVar35;
            pIVar1[uVar19 + 1] = IVar45;
            *puVar21 = uVar26;
            puVar21[1] = uVar22;
            if (bVar20 == 0) {
              puVar21[2] = uVar22 + 2;
              puVar21[3] = uVar22 + 2;
              puVar21[4] = uVar26 + 2;
              puVar21[5] = uVar26;
              puVar21[6] = uVar26 + 1;
              puVar21[7] = uVar22 + 1;
              puVar21[8] = uVar22;
              puVar21[9] = uVar22;
              puVar21[10] = uVar26;
              puVar21[0xb] = uVar26 + 1;
              lVar13 = 0x30;
            }
            else {
              puVar21[2] = uVar22 + 1;
              puVar21[3] = uVar26 + 1;
              puVar21[4] = uVar22 + 1;
              puVar21[5] = uVar26;
              lVar13 = 0x18;
            }
            puVar21 = (uint *)((long)puVar21 + lVar13);
            this->_IdxWritePtr = puVar21;
            bVar27 = uVar14 != uVar18;
            uVar14 = uVar14 + 1;
            uVar22 = uVar26;
          } while (bVar27);
        }
        if (bVar20 == 0) {
          if (0 < points_count) {
            lVar13 = 0;
            do {
              this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar13);
              this->_VtxWritePtr->uv = IVar3;
              pIVar4 = this->_VtxWritePtr;
              pIVar4->col = col;
              pIVar4[1].pos = *(ImVec2 *)((long)&pIVar10[uVar25].x + lVar13 * 2);
              this->_VtxWritePtr[1].uv = IVar3;
              pIVar4 = this->_VtxWritePtr;
              pIVar4[1].col = uVar24;
              pIVar4[2].pos = *(ImVec2 *)((long)&pIVar10[uVar25 + 1].x + lVar13 * 2);
              this->_VtxWritePtr[2].uv = IVar3;
              pIVar4 = this->_VtxWritePtr;
              pIVar4[2].col = uVar24;
              this->_VtxWritePtr = pIVar4 + 3;
              lVar13 = lVar13 + 8;
            } while (uVar25 * 8 - lVar13 != 0);
          }
        }
        else if (0 < points_count) {
          pIVar6 = this->_Data->TexUvLines;
          pIVar2 = pIVar6 + iVar15;
          auVar41._4_4_ = pIVar2->x;
          fVar35 = pIVar2->y;
          pIVar6 = pIVar6 + iVar15;
          fVar28 = pIVar6->z;
          fVar34 = pIVar6->w;
          lVar13 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)&pIVar10[uVar25].x + lVar13);
            pIVar4 = this->_VtxWritePtr;
            (pIVar4->uv).x = auVar41._4_4_;
            (pIVar4->uv).y = fVar35;
            pIVar4 = this->_VtxWritePtr;
            pIVar4->col = col;
            pIVar4[1].pos = *(ImVec2 *)((long)&pIVar10[uVar25 + 1].x + lVar13);
            pIVar4 = this->_VtxWritePtr;
            pIVar4[1].uv.x = fVar28;
            pIVar4[1].uv.y = fVar34;
            pIVar4 = this->_VtxWritePtr;
            pIVar4[1].col = col;
            this->_VtxWritePtr = pIVar4 + 2;
            lVar13 = lVar13 + 0x10;
          } while (uVar25 * 0x10 != lVar13);
        }
      }
      else {
        auVar41._4_4_ = (auVar41._4_4_ - fVar35) * 0.5;
        fVar35 = fVar35 + auVar41._4_4_;
        if ((flags & 1U) == 0) {
          IVar33.x = (*points).x + (*pIVar10).x * fVar35;
          IVar33.y = (*points).y + (*pIVar10).y * fVar35;
          *pIVar1 = IVar33;
          fVar28 = (*pIVar10).x;
          fVar36 = auVar41._4_4_ * fVar28;
          fVar34 = (*pIVar10).y;
          fVar43 = auVar41._4_4_ * fVar34;
          IVar46.x = (*points).x + fVar36;
          IVar46.y = (*points).y + fVar43;
          pIVar1[1] = IVar46;
          IVar47.x = (*points).x - fVar36;
          IVar47.y = (*points).y - fVar43;
          pIVar1[2] = IVar47;
          IVar37.x = (*points).x - fVar28 * fVar35;
          IVar37.y = (*points).y - fVar34 * fVar35;
          pIVar1[3] = IVar37;
          IVar38.x = points[uVar14].x + pIVar10[uVar14].x * fVar35;
          IVar38.y = points[uVar14].y + pIVar10[uVar14].y * fVar35;
          uVar12 = (ulong)(uVar22 * 4);
          pIVar1[uVar12] = IVar38;
          IVar39.x = points[uVar14].x + pIVar10[uVar14].x * auVar41._4_4_;
          IVar39.y = points[uVar14].y + pIVar10[uVar14].y * auVar41._4_4_;
          pIVar1[uVar12 + 1] = IVar39;
          IVar9.y = points[uVar14].y - pIVar10[uVar14].y * auVar41._4_4_;
          IVar9.x = points[uVar14].x - pIVar10[uVar14].x * auVar41._4_4_;
          pIVar1[uVar12 + 2] = IVar9;
          IVar7.y = points[uVar14].y - pIVar10[uVar14].y * fVar35;
          IVar7.x = points[uVar14].x - pIVar10[uVar14].x * fVar35;
          pIVar1[uVar12 + 3] = IVar7;
        }
        if (0 < iVar16) {
          puVar21 = this->_IdxWritePtr;
          uVar14 = 1;
          lVar13 = 0;
          uVar22 = this->_VtxCurrentIdx;
          do {
            bVar27 = uVar25 * 0x48 + -0x48 == lVar13;
            uVar12 = uVar14 & 0xffffffff;
            if (bVar27) {
              uVar12 = 0;
            }
            uVar26 = uVar22 + 4;
            if (bVar27) {
              uVar26 = this->_VtxCurrentIdx;
            }
            fVar28 = (pIVar10[uVar12].x + pIVar10[uVar14 - 1].x) * 0.5;
            fVar34 = (pIVar10[uVar12].y + pIVar10[uVar14 - 1].y) * 0.5;
            fVar36 = fVar28 * fVar28 + fVar34 * fVar34;
            if (1e-06 < fVar36) {
              fVar36 = 1.0 / fVar36;
              fVar43 = 100.0;
              if (fVar36 <= 100.0) {
                fVar43 = fVar36;
              }
              fVar28 = fVar28 * fVar43;
              fVar34 = fVar34 * fVar43;
            }
            uVar19 = (ulong)(uint)((int)uVar12 * 4);
            IVar48.x = points[uVar12].x + fVar35 * fVar28;
            IVar48.y = points[uVar12].y + fVar35 * fVar34;
            pIVar1[uVar19] = IVar48;
            IVar49.x = points[uVar12].x + fVar28 * auVar41._4_4_;
            IVar49.y = points[uVar12].y + fVar34 * auVar41._4_4_;
            pIVar1[uVar19 + 1] = IVar49;
            IVar50.x = points[uVar12].x - fVar28 * auVar41._4_4_;
            IVar50.y = points[uVar12].y - fVar34 * auVar41._4_4_;
            pIVar1[uVar19 + 2] = IVar50;
            IVar40.x = points[uVar12].x - fVar35 * fVar28;
            IVar40.y = points[uVar12].y - fVar35 * fVar34;
            pIVar1[uVar19 + 3] = IVar40;
            iVar17 = uVar26 + 1;
            *(int *)((long)puVar21 + lVar13) = iVar17;
            *(uint *)((long)puVar21 + lVar13 + 4) = uVar22 + 1;
            iVar16 = uVar22 + 2;
            *(int *)((long)puVar21 + lVar13 + 8) = iVar16;
            *(int *)((long)puVar21 + lVar13 + 0xc) = iVar16;
            iVar15 = uVar26 + 2;
            *(int *)((long)puVar21 + lVar13 + 0x10) = iVar15;
            *(int *)((long)puVar21 + lVar13 + 0x14) = iVar17;
            *(int *)((long)puVar21 + lVar13 + 0x18) = iVar17;
            *(uint *)((long)puVar21 + lVar13 + 0x1c) = uVar22 + 1;
            *(uint *)((long)puVar21 + lVar13 + 0x20) = uVar22;
            *(uint *)((long)puVar21 + lVar13 + 0x24) = uVar22;
            *(uint *)((long)puVar21 + lVar13 + 0x28) = uVar26;
            *(int *)((long)puVar21 + lVar13 + 0x2c) = iVar17;
            *(int *)((long)puVar21 + lVar13 + 0x30) = iVar15;
            *(int *)((long)puVar21 + lVar13 + 0x34) = iVar16;
            *(uint *)((long)puVar21 + lVar13 + 0x38) = uVar22 + 3;
            *(uint *)((long)puVar21 + lVar13 + 0x3c) = uVar22 + 3;
            *(uint *)((long)puVar21 + lVar13 + 0x40) = uVar26 + 3;
            *(int *)((long)puVar21 + lVar13 + 0x44) = iVar15;
            uVar14 = uVar14 + 1;
            lVar13 = lVar13 + 0x48;
            uVar22 = uVar26;
          } while (uVar18 * 0x48 != lVar13);
          this->_IdxWritePtr = (uint *)((long)puVar21 + lVar13);
        }
        if (0 < points_count) {
          lVar13 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)&pIVar10[uVar25].x + lVar13);
            this->_VtxWritePtr->uv = IVar3;
            pIVar4 = this->_VtxWritePtr;
            pIVar4->col = uVar24;
            pIVar4[1].pos = *(ImVec2 *)((long)&pIVar10[uVar25 + 1].x + lVar13);
            this->_VtxWritePtr[1].uv = IVar3;
            pIVar4 = this->_VtxWritePtr;
            pIVar4[1].col = col;
            pIVar4[2].pos = *(ImVec2 *)((long)&pIVar10[uVar25 + 2].x + lVar13);
            this->_VtxWritePtr[2].uv = IVar3;
            pIVar4 = this->_VtxWritePtr;
            pIVar4[2].col = col;
            pIVar4[3].pos = *(ImVec2 *)((long)&pIVar10[uVar25 + 3].x + lVar13);
            this->_VtxWritePtr[3].uv = IVar3;
            pIVar4 = this->_VtxWritePtr;
            pIVar4[3].col = uVar24;
            this->_VtxWritePtr = pIVar4 + 4;
            lVar13 = lVar13 + 0x20;
          } while (uVar25 * 0x20 != lVar13);
        }
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + iVar11;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, ImDrawFlags flags, float thickness)
{
    if (points_count < 2 || (col & IM_COL32_A_MASK) == 0)
        return;

    const bool closed = (flags & ImDrawFlags_Closed) != 0;
    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        _Data->TempBuffer.reserve_discard(points_count * ((use_texture || !thick_line) ? 3 : 5));
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}